

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml.cpp
# Opt level: O1

void __thiscall
despot::util::tinyxml::TiXmlDocument::CopyTo(TiXmlDocument *this,TiXmlDocument *target)

{
  Rep *pRVar1;
  int iVar2;
  size_t len;
  undefined4 extraout_var;
  TiXmlNode *pTVar3;
  char *__s;
  
  __s = ((this->super_TiXmlNode).value.rep_)->str;
  len = strlen(__s);
  TiXmlString::assign(&(target->super_TiXmlNode).value,__s,len);
  (target->super_TiXmlNode).super_TiXmlBase.userData =
       (this->super_TiXmlNode).super_TiXmlBase.userData;
  target->error = this->error;
  target->errorId = this->errorId;
  pRVar1 = (this->errorDesc).rep_;
  TiXmlString::assign(&target->errorDesc,pRVar1->str,pRVar1->size);
  target->tabsize = this->tabsize;
  target->errorLocation = this->errorLocation;
  target->useMicrosoftBOM = this->useMicrosoftBOM;
  for (pTVar3 = (this->super_TiXmlNode).firstChild; pTVar3 != (TiXmlNode *)0x0;
      pTVar3 = pTVar3->next) {
    iVar2 = (*(pTVar3->super_TiXmlBase)._vptr_TiXmlBase[0x10])(pTVar3);
    TiXmlNode::LinkEndChild(&target->super_TiXmlNode,(TiXmlNode *)CONCAT44(extraout_var,iVar2));
  }
  return;
}

Assistant:

void TiXmlDocument::CopyTo(TiXmlDocument* target) const {
	TiXmlNode::CopyTo(target);

	target->error = error;
	target->errorId = errorId;
	target->errorDesc = errorDesc;
	target->tabsize = tabsize;
	target->errorLocation = errorLocation;
	target->useMicrosoftBOM = useMicrosoftBOM;

	TiXmlNode* node = 0;
	for (node = firstChild; node; node = node->NextSibling()) {
		target->LinkEndChild(node->Clone());
	}
}